

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string_tests.cpp
# Opt level: O0

void check_encode_base64<wchar_t>
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *input,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  first;
  ulong uVar1;
  ulong uVar2;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Var3;
  ExprLhs<const_unsigned_long_&> this;
  StringRef *pSVar4;
  conv_errc cVar5;
  ulong in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  type tVar6;
  AssertionHandler catchAssertionHandler_3;
  size_t i_1;
  AssertionHandler catchAssertionHandler_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  AssertionHandler catchAssertionHandler_1;
  size_t i;
  AssertionHandler catchAssertionHandler;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> result;
  ExprLhs<const_unsigned_char_&> in_stack_fffffffffffffbe8;
  AssertionHandler *in_stack_fffffffffffffbf0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffbf8;
  StringRef *macroName;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  SourceLineInfo *this_00;
  size_type in_stack_fffffffffffffc10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result_00;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  ExprLhs<const_wchar_t_&> *in_stack_fffffffffffffc28;
  AssertionHandler local_348;
  StringRef *local_2e0;
  size_type local_2d8;
  size_type local_2d0;
  unsigned_long *local_2c0;
  SourceLineInfo local_278;
  StringRef local_268;
  wchar_t *local_210;
  conv_errc local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  wchar_t *local_1d0;
  SourceLineInfo local_188;
  StringRef local_178;
  ulong local_120;
  undefined8 local_118;
  undefined8 local_110;
  unsigned_long *local_100;
  SourceLineInfo local_b8;
  StringRef local_a8;
  uchar *local_40;
  uchar *local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ulong local_10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::wstring::wstring((wstring *)&local_30);
  local_38 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (in_stack_fffffffffffffbe8.m_lhs);
  local_40 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                (in_stack_fffffffffffffbe8.m_lhs);
  jsoncons::
  encode_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__cxx11::wstring>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffffbf0);
  local_a8 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8.m_lhs);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/utility/byte_string_tests.cpp"
             ,0x18);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffc00._M_current,
             (char *)in_stack_fffffffffffffbf8._M_current);
  capturedExpression.m_size = in_stack_fffffffffffffc10;
  capturedExpression.m_start = in_stack_fffffffffffffc08;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)in_stack_fffffffffffffc00._M_current,
             (StringRef *)in_stack_fffffffffffffbf8._M_current,
             (SourceLineInfo *)in_stack_fffffffffffffbf0,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffbe8.m_lhs >> 0x20));
  local_110 = std::__cxx11::wstring::size();
  local_100 = (unsigned_long *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)in_stack_fffffffffffffbe8.m_lhs,(unsigned_long *)0x97f130);
  local_118 = std::__cxx11::wstring::size();
  Catch::ExprLhs<unsigned_long_const&>::operator==
            ((ExprLhs<const_unsigned_long_&> *)in_stack_fffffffffffffc28,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffbf0,(ITransientExpression *)in_stack_fffffffffffffbe8.m_lhs);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x97f19c);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffbf0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffbf0);
  local_120 = 0;
  while( true ) {
    uVar1 = local_120;
    uVar2 = std::__cxx11::wstring::size();
    if (uVar2 <= uVar1) break;
    local_178 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8.m_lhs
                          );
    Catch::SourceLineInfo::SourceLineInfo
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/utility/byte_string_tests.cpp"
               ,0x1b);
    Catch::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffc00._M_current,
               (char *)in_stack_fffffffffffffbf8._M_current);
    capturedExpression_00.m_size = in_stack_fffffffffffffc10;
    capturedExpression_00.m_start = in_stack_fffffffffffffc08;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)in_stack_fffffffffffffc00._M_current,
               (StringRef *)in_stack_fffffffffffffbf8._M_current,
               (SourceLineInfo *)in_stack_fffffffffffffbf0,capturedExpression_00,
               (Flags)((ulong)in_stack_fffffffffffffbe8.m_lhs >> 0x20));
    std::__cxx11::wstring::operator[]((ulong)&local_30);
    local_1d0 = (wchar_t *)
                Catch::Decomposer::operator<=
                          ((Decomposer *)in_stack_fffffffffffffbe8.m_lhs,(wchar_t *)0x97f31d);
    std::__cxx11::wstring::operator[](local_10);
    Catch::ExprLhs<wchar_t_const&>::operator==
              (in_stack_fffffffffffffc28,
               (wchar_t *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffbf0,(ITransientExpression *)in_stack_fffffffffffffbe8.m_lhs);
    Catch::BinaryExpr<const_wchar_t_&,_const_wchar_t_&>::~BinaryExpr
              ((BinaryExpr<const_wchar_t_&,_const_wchar_t_&> *)0x97f384);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffbf0);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffbf0);
    local_120 = local_120 + 1;
  }
  _Var3._M_current = (wchar_t *)&local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x97f4ba);
  result_00 = &local_30;
  local_1f8 = std::__cxx11::wstring::begin();
  local_200 = std::__cxx11::wstring::end();
  first._M_current._4_4_ = in_stack_fffffffffffffc24;
  first._M_current._0_4_ = in_stack_fffffffffffffc20;
  tVar6 = jsoncons::
          decode_base64<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (first,_Var3,result_00);
  _Var3 = tVar6.it._M_current;
  cVar5 = tVar6.ec;
  local_210 = _Var3._M_current;
  local_208 = cVar5;
  local_268 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8.m_lhs);
  this_00 = &local_278;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/utility/byte_string_tests.cpp"
             ,0x20);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffc00._M_current,
             (char *)in_stack_fffffffffffffbf8._M_current);
  capturedExpression_01.m_size = (size_type)result_00;
  capturedExpression_01.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)in_stack_fffffffffffffc00._M_current,
             (StringRef *)in_stack_fffffffffffffbf8._M_current,
             (SourceLineInfo *)in_stack_fffffffffffffbf0,capturedExpression_01,
             (Flags)((ulong)in_stack_fffffffffffffbe8.m_lhs >> 0x20));
  local_2d0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_1f0);
  this = Catch::Decomposer::operator<=
                   ((Decomposer *)in_stack_fffffffffffffbe8.m_lhs,(unsigned_long *)0x97f5d2);
  local_2c0 = this.m_lhs;
  local_2d8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_8);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            ((ExprLhs<const_unsigned_long_&> *)_Var3._M_current,
             (unsigned_long *)CONCAT44(cVar5,in_stack_fffffffffffffc20));
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffbf0,(ITransientExpression *)in_stack_fffffffffffffbe8.m_lhs);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x97f63e);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffbf0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffbf0);
  local_2e0 = (StringRef *)0x0;
  while( true ) {
    macroName = local_2e0;
    pSVar4 = (StringRef *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_1f0);
    if (pSVar4 <= macroName) break;
    local_348.m_assertionInfo.lineInfo =
         (SourceLineInfo)
         operator____catch_sr
                   ((char *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8.m_lhs);
    in_stack_fffffffffffffbf0 = &local_348;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)in_stack_fffffffffffffbf0,
               "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/utility/byte_string_tests.cpp"
               ,0x23);
    Catch::StringRef::StringRef((StringRef *)this.m_lhs,(char *)macroName);
    capturedExpression_02.m_size = (size_type)result_00;
    capturedExpression_02.m_start = (char *)this_00;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)this.m_lhs,macroName,(SourceLineInfo *)in_stack_fffffffffffffbf0,
               capturedExpression_02,(Flags)((ulong)in_stack_fffffffffffffbe8.m_lhs >> 0x20));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (&local_1f0,(size_type)local_2e0);
    in_stack_fffffffffffffbe8 =
         Catch::Decomposer::operator<=(in_stack_fffffffffffffbe8.m_lhs,(uchar *)0x97f7b6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (local_8,(size_type)local_2e0);
    Catch::ExprLhs<unsigned_char_const&>::operator==
              ((ExprLhs<const_unsigned_char_&> *)_Var3._M_current,
               (uchar *)CONCAT44(cVar5,in_stack_fffffffffffffc20));
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffbf0,(ITransientExpression *)in_stack_fffffffffffffbe8.m_lhs);
    Catch::BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&>::~BinaryExpr
              ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)0x97f81b);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffbf0);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffbf0);
    local_2e0 = (StringRef *)((long)&local_2e0->m_start + 1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this.m_lhs);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  return;
}

Assistant:

void check_encode_base64(const std::vector<uint8_t>& input, const std::basic_string<CharT>& expected)
{
    std::basic_string<CharT> result;
    encode_base64(input.begin(),input.end(),result);
    REQUIRE(result.size() == expected.size());
    for (std::size_t i = 0; i < result.size(); ++i)
    {
        CHECK(result[i] == expected[i]);
    }

    std::vector<uint8_t> output;
    decode_base64(result.begin(), result.end(), output);
    REQUIRE(output.size() == input.size());
    for (std::size_t i = 0; i < output.size(); ++i)
    {
        CHECK(output[i] == input[i]);
    }
}